

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgsStreamReader.cpp
# Opt level: O3

void __thiscall PGSStreamReader::intDecodeStream(PGSStreamReader *this,uint8_t *buffer,size_t len)

{
  uint8_t uVar1;
  uint16_t uVar2;
  uint8_t *curPos;
  long lVar3;
  uint8_t *end;
  BitStreamReader bitReader;
  BitStreamReader local_48;
  
  if (0 < (long)len) {
    end = buffer + len;
    do {
      lVar3 = (long)end - (long)buffer;
      if (lVar3 < 10) {
        return;
      }
      uVar1 = *buffer;
      if (uVar1 == '\0') {
        if (((buffer[1] == '\0') && (buffer[2] == '\x01')) &&
           (buffer = buffer + (byte)(buffer[8] + 9), end <= buffer)) {
          return;
        }
LAB_001c8ff8:
        uVar1 = *buffer;
        lVar3 = (long)end - (long)buffer;
      }
      else if (uVar1 == 'P') {
        if (buffer[1] == 'G') {
          buffer = buffer + 10;
        }
        goto LAB_001c8ff8;
      }
      uVar2 = AV_RB16(buffer + 1);
      if (lVar3 < (long)((ulong)uVar2 + 3)) {
        return;
      }
      if (uVar1 == '\x16') {
        local_48.super_BitStream.m_totalBits = 0;
        local_48.super_BitStream.m_buffer = (uint *)0x0;
        local_48.super_BitStream.m_initBuffer = (uint *)0x0;
        local_48.m_curVal = 0;
        local_48.m_bitLeft = 0;
        BitStream::setBuffer(&local_48.super_BitStream,buffer + 3,end);
        local_48._24_8_ = local_48._24_8_ & 0xffffffff;
        local_48.m_curVal = BitStreamReader::getCurVal(&local_48,local_48.super_BitStream.m_buffer);
        local_48.m_bitLeft = 0x20;
        video_descriptor(this,&local_48);
        return;
      }
      buffer = buffer + 3 + uVar2;
    } while (buffer < end);
  }
  return;
}

Assistant:

void PGSStreamReader::intDecodeStream(uint8_t* buffer, const size_t len)
{
    const uint8_t* bufEnd = buffer + len;
    uint8_t* curPos = buffer;
    while (curPos < bufEnd)
    {
        if (bufEnd - curPos < 10)
            return;
        if (curPos[0] == 'P' && curPos[1] == 'G')
            curPos += 10;
        else if (curPos[0] == 0 && curPos[1] == 0 && curPos[2] == 1)
        {
            const auto pesPacket = reinterpret_cast<PESPacket*>(curPos);
            curPos += pesPacket->getHeaderLength();
            if (curPos >= bufEnd)
                return;
        }

        const uint8_t segment_type = *curPos;
        const auto segment_len = AV_RB16(curPos + 1);
        if (bufEnd - curPos < 3ll + segment_len)
            return;

        curPos += 3;
        if (segment_type == 0x16)
        {
            BitStreamReader bitReader{};
            bitReader.setBuffer(curPos, bufEnd);
            video_descriptor(bitReader);
            return;
        }
        curPos += segment_len;
    }
}